

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorBase::grow_pod
          (SmallVectorBase *this,void *FirstEl,size_t MinSizeInBytes,size_t TSize)

{
  size_t __n;
  size_t sVar1;
  long in_RCX;
  ulong in_RDX;
  void *in_RSI;
  SmallVectorBase *in_RDI;
  void *NewElts;
  size_t NewCapacityInBytes;
  size_t CurSizeBytes;
  void *local_38;
  size_t local_30;
  
  __n = size_in_bytes(in_RDI);
  sVar1 = capacity_in_bytes(in_RDI);
  local_30 = sVar1 * 2 + in_RCX;
  if (local_30 < in_RDX) {
    local_30 = in_RDX;
  }
  if (in_RDI->BeginX == in_RSI) {
    local_38 = malloc(local_30);
    memcpy(local_38,in_RDI->BeginX,__n);
  }
  else {
    local_38 = realloc(in_RDI->BeginX,local_30);
  }
  in_RDI->EndX = (void *)((long)local_38 + __n);
  in_RDI->BeginX = local_38;
  in_RDI->CapacityX = (void *)((long)in_RDI->BeginX + local_30);
  return;
}

Assistant:

void grow_pod(void *FirstEl, size_t MinSizeInBytes, size_t TSize){
    size_t CurSizeBytes = size_in_bytes();
    size_t NewCapacityInBytes = 2 * capacity_in_bytes() + TSize; // Always grow.
    if (NewCapacityInBytes < MinSizeInBytes) {
      NewCapacityInBytes = MinSizeInBytes;
    }

    void *NewElts;
    if (BeginX == FirstEl) {
      NewElts = std::malloc(NewCapacityInBytes);

      // Copy the elements over.  No need to run dtors on PODs.
      memcpy(NewElts, this->BeginX, CurSizeBytes);
    } else {
      // If this wasn't grown from the inline copy, grow the allocated space.
      NewElts = realloc(this->BeginX, NewCapacityInBytes);
    }
    //assert(NewElts && "Out of memory");

    this->EndX = (char*)NewElts+CurSizeBytes;
    this->BeginX = NewElts;
    this->CapacityX = (char*)this->BeginX + NewCapacityInBytes;
  }